

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void extract_char(CHAR_DATA *ch,bool fPull)

{
  OBJ_DATA *pOVar1;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  byte bVar2;
  bool bVar3;
  byte in_SIL;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  CHAR_DATA *prev;
  char vn [50];
  AFFECT_DATA *af;
  ROOM_AFFECT_DATA *raf;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *tch;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  CHAR_DATA *wch;
  char *in_stack_00001118;
  CHAR_DATA *in_stack_00001120;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  CHAR_DATA *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  CHAR_DATA *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff30;
  ROOM_INDEX_DATA *in_stack_ffffffffffffff38;
  CHAR_DATA *in_stack_ffffffffffffff40;
  CLogger *in_stack_ffffffffffffff48;
  CHAR_DATA *pCVar5;
  size_t in_stack_ffffffffffffff50;
  ROOM_AFFECT_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *in_stack_ffffffffffffff60;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CQueue *in_stack_ffffffffffffff70;
  undefined1 local_88 [40];
  CHAR_DATA *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  AFFECT_DATA *local_48;
  ROOM_AFFECT_DATA *local_40;
  ROOM_INDEX_DATA *local_38;
  CHAR_DATA *local_30;
  OBJ_DATA *local_20;
  CHAR_DATA *local_18;
  
  bVar2 = in_SIL & 1;
  if (in_RDI->in_room == (ROOM_INDEX_DATA *)0x0) {
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (bVar3) {
      sprintf(local_88,"%d",(ulong)(uint)(int)in_RDI->pIndexData->vnum);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (bVar3) {
      in_stack_ffffffffffffff30 = "Vnum is ";
    }
    else {
      in_stack_ffffffffffffff30 = "Name is ";
    }
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (bVar3) {
      in_stack_ffffffffffffff20 = (CHAR_DATA *)local_88;
    }
    else {
      in_stack_ffffffffffffff20 = (CHAR_DATA *)in_RDI->name;
    }
    fmt_00._M_str = (char *)in_stack_ffffffffffffff58;
    fmt_00._M_len = in_stack_ffffffffffffff50;
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff20;
    CLogger::Warn<char_const(&)[9],char*>
              (in_stack_ffffffffffffff48,fmt_00,(char (*) [9])in_stack_ffffffffffffff40,
               (char **)in_stack_ffffffffffffff38);
  }
  for (local_30 = char_list; local_30 != (CHAR_DATA *)0x0; local_30 = local_30->next) {
    if (local_30->last_fought == in_RDI) {
      local_30->last_fought = (CHAR_DATA *)0x0;
    }
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (((!bVar3) &&
        (bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
        !bVar3)) && (local_30->last_fight_name == in_RDI->true_name)) {
      local_30->last_fight_name = (char *)0x0;
    }
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (((!bVar3) &&
        (bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
        !bVar3)) && (local_30->pcdata->trusting == in_RDI)) {
      local_30->pcdata->trusting = (CHAR_DATA *)0x0;
    }
    for (local_48 = local_30->affected; local_48 != (AFFECT_DATA *)0x0; local_48 = local_48->next) {
      if (local_48->owner == in_RDI) {
        local_48->owner = (CHAR_DATA *)0x0;
      }
    }
  }
  nuke_pets(in_stack_ffffffffffffff10);
  in_RDI->pet = (CHAR_DATA *)0x0;
  if (bVar2 != 0) {
    die_follower(in_stack_ffffffffffffff20);
  }
  stop_fighting(in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  pOVar1 = in_RDI->carrying;
  while (local_20 = pOVar1, local_20 != (OBJ_DATA *)0x0) {
    pOVar1 = local_20->next_content;
    if (local_20->wear_loc != 0x13) {
      in_stack_ffffffffffffff18 = (char *)local_20->extra_flags[0];
      _Var4 = std::pow<int,int>(0,0x5f967b);
      if ((((ulong)in_stack_ffffffffffffff18 & (long)_Var4) == 0) &&
         (bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
         , !bVar3)) {
        bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        if ((!bVar3) && (bVar2 != 0)) {
          local_20->pIndexData->limcount = local_20->pIndexData->limcount + 1;
        }
        extract_obj((OBJ_DATA *)in_stack_ffffffffffffff30);
      }
    }
  }
  char_from_room(in_stack_ffffffffffffff60);
  bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  if ((bVar3) &&
     (bVar3 = CQueue::HasQueuePending((CQueue *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
     , bVar3)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    fmt_01._M_str = (char *)in_stack_ffffffffffffff58;
    fmt_01._M_len = in_stack_ffffffffffffff50;
    CLogger::Warn<short&>(in_stack_ffffffffffffff48,fmt_01,(short *)in_stack_ffffffffffffff40);
    CQueue::DeleteQueuedEventsInvolving(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if ((bVar2 != 0) ||
     (bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
     bVar3)) {
    bVar3 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (bVar3) {
      in_RDI->pIndexData->count = in_RDI->pIndexData->count + -1;
      total_wealth = total_wealth - in_RDI->pIndexData->wealth;
    }
    if ((in_RDI->desc != (DESCRIPTOR_DATA *)0x0) && (in_RDI->desc->original != (CHAR_DATA *)0x0)) {
      do_return(in_stack_00001120,in_stack_00001118);
      in_RDI->desc = (DESCRIPTOR_DATA *)0x0;
    }
    for (local_18 = char_list; local_18 != (CHAR_DATA *)0x0; local_18 = local_18->next) {
      if (local_18->reply == in_RDI) {
        local_18->reply = (CHAR_DATA *)0x0;
      }
    }
    for (local_38 = top_affected_room; local_38 != (ROOM_INDEX_DATA *)0x0;
        local_38 = local_38->aff_next) {
      for (local_40 = local_38->affected; local_40 != (ROOM_AFFECT_DATA *)0x0;
          local_40 = local_40->next) {
        if (local_40->owner == in_RDI) {
          affect_remove_room((ROOM_INDEX_DATA *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
          ;
        }
      }
    }
    pCVar5 = char_list;
    if (in_RDI == char_list) {
      char_list = in_RDI->next;
    }
    else {
      for (; pCVar5 != (CHAR_DATA *)0x0; pCVar5 = pCVar5->next) {
        if (pCVar5->next == in_RDI) {
          pCVar5->next = in_RDI->next;
          break;
        }
      }
      if (pCVar5 == (CHAR_DATA *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        fmt._M_str = (char *)in_stack_ffffffffffffff40;
        fmt._M_len = (size_t)in_stack_ffffffffffffff38;
        CLogger::Warn<>((CLogger *)in_stack_ffffffffffffff30,fmt);
        return;
      }
    }
    if (in_RDI->desc != (DESCRIPTOR_DATA *)0x0) {
      in_RDI->desc->character = (CHAR_DATA *)0x0;
    }
    free_char(in_stack_ffffffffffffff20);
  }
  else {
    get_room_index((int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    char_to_room(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void extract_char(CHAR_DATA *ch, bool fPull)
{
	CHAR_DATA *wch;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	CHAR_DATA *tch;
	ROOM_INDEX_DATA *room;
	ROOM_AFFECT_DATA *raf;
	AFFECT_DATA *af;

	if (ch->in_room == nullptr)
	{
		char vn[50];

		if (is_npc(ch))
			sprintf(vn, "%d", ch->pIndexData->vnum);

		RS.Logger.Warn("Extract_char: in_room is nullptr.  {}{}.",
			is_npc(ch) ? "Vnum is " : "Name is ",
			is_npc(ch) ? vn : ch->name);
	}
	/* remove all tracking */
	for (tch = char_list; tch != nullptr; tch = tch->next)
	{
		if (tch->last_fought == ch)
			tch->last_fought = nullptr;

		if (!is_npc(ch) && !is_npc(tch) && tch->last_fight_name == ch->true_name)
			tch->last_fight_name = nullptr;

		if (!is_npc(tch) && !is_npc(ch) && tch->pcdata->trusting == ch)
			tch->pcdata->trusting = nullptr;

		for (af = tch->affected; af; af = af->next)
		{
			if (af->owner == ch)
				af->owner = nullptr;
		}
	}

	nuke_pets(ch);
	ch->pet = nullptr; /* just in case */

	if (fPull)
		die_follower(ch);

	stop_fighting(ch, true);

	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		obj_next = obj->next_content;

		if (!(obj->wear_loc == WEAR_BRAND || IS_SET(obj->extra_flags, ITEM_FIXED)) && !is_npc(ch))
		{
			if (!is_npc(ch) && (fPull))
				obj->pIndexData->limcount++;

			extract_obj(obj);
		}
	}

	char_from_room(ch);

	if (is_npc(ch) && RS.Queue.HasQueuePending(ch))
	{
		RS.Logger.Warn("Attempt at extracting mob {} while it has queue events pending.  Deleting events.", ch->pIndexData->vnum);
		RS.Queue.DeleteQueuedEventsInvolving(ch);
	}

	/* Death room is set in the cabal table now */
	if (!fPull && !is_npc(ch))
		return char_to_room(ch, get_room_index(ROOM_VNUM_ALTAR));

	if (is_npc(ch))
	{
		--ch->pIndexData->count;
		total_wealth -= ch->pIndexData->wealth;
	}

	if (ch->desc != nullptr && ch->desc->original != nullptr)
	{
		do_return(ch, "");
		ch->desc = nullptr;
	}

	for (wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (wch->reply == ch)
			wch->reply = nullptr;
	}

	for (room = top_affected_room; room; room = room->aff_next)
	{
		for (raf = room->affected; raf != nullptr; raf = raf->next)
		{
			if (raf->owner == ch)
			{
				affect_remove_room(room, raf);
			}
		}
	}

	if (ch == char_list)
	{
		char_list = ch->next;
	}
	else
	{
		CHAR_DATA *prev;
		for (prev = char_list; prev != nullptr; prev = prev->next)
		{
			if (prev->next == ch)
			{
				prev->next = ch->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Extract_char: char not found.");
			return;
		}
	}

	if (ch->desc != nullptr)
		ch->desc->character = nullptr;

	free_char(ch);
}